

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O0

void __thiscall PerseusStationary::SetValueFunction(PerseusStationary *this,string *filename)

{
  PlanningUnitMADPDiscrete *this_00;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RDI;
  size_t in_stack_00000028;
  size_t in_stack_00000030;
  ValueFunctionPOMDPDiscrete *in_stack_00000038;
  string *in_stack_000005e8;
  AlphaVectorPlanning *this_01;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_ffffffffffffffc0;
  
  AlphaVectorPlanning::ImportValueFunction(in_stack_000005e8);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
            (in_stack_ffffffffffffffc0,in_RDI);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(in_stack_ffffffffffffffc0);
  this_01 = (AlphaVectorPlanning *)(in_RDI + 6);
  AlphaVectorPlanning::GetPU(this_01);
  this_00 = (PlanningUnitMADPDiscrete *)
            PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x95b1cd);
  AlphaVectorPlanning::GetPU(this_01);
  PlanningUnitMADPDiscrete::GetNrStates(this_00);
  AlphaVectorPlanning::ValueFunctionToQ(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)in_stack_ffffffffffffffc0,
              (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)in_RDI);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void PerseusStationary::SetValueFunction(const string &filename)
{
    _m_valueFunction=ImportValueFunction(filename);
    _m_qFunction=AlphaVectorPlanning::
        ValueFunctionToQ(_m_valueFunction,
                         GetPU()->GetNrJointActions(),
                         GetPU()->GetNrStates());
}